

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
::AssertHashEqConsistent<google::protobuf::Descriptor_const*>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<google::protobuf::Descriptor_const*>>
           *this,Descriptor **key)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  slot_type pDVar3;
  slot_type pDVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 *puVar19;
  ushort uVar20;
  Descriptor **key_1;
  slot_type *ppDVar21;
  SymbolBase *pSVar22;
  uint64_t v;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  uint64_t v_6;
  uint uVar26;
  uint64_t v_10;
  
  if (1 < *(ulong *)(this + 8)) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = &(*key)->super_SymbolBase +
                   (SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8));
    uVar23 = SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar25 = *(ulong *)this;
    if (uVar25 == 1) {
      ppDVar21 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             *)this);
      pDVar3 = *ppDVar21;
      pDVar4 = *key;
      if ((pDVar3 == pDVar4) &&
         (auVar11._8_8_ = 0,
         auVar11._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar3,
         auVar12._8_8_ = 0,
         auVar12._0_8_ =
              &pDVar3->super_SymbolBase +
              (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0) ^
              SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8)),
         uVar23 != (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8) ^
                   SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0)))) {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar4;
        pSVar22 = &pDVar4->super_SymbolBase +
                  (SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),0) ^
                  SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),8));
LAB_0021ba75:
        auVar17._8_8_ = 0;
        auVar17._0_8_ = pSVar22;
        if (uVar23 != (SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),8) ^
                      SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),0))) {
          __assert_fail("hash_of_arg == once_more_hash_arg && \"hash is not idempotent.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xf10,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::AssertHashEqConsistent(const google::protobuf::Descriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                       );
        }
        __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf1b,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::AssertHashEqConsistent(const google::protobuf::Descriptor *const &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                     );
      }
    }
    else {
      if (uVar25 == 0) {
        __assert_fail("!kEnabled || cap >= kCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb37,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                     );
      }
      if (uVar25 < 0x11) {
        ppDVar21 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                 *)this);
        uVar25 = *(ulong *)this;
        pauVar24 = *(undefined1 (**) [16])(this + 0x10);
        if (uVar25 < 0xf) {
          if (8 < uVar25) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar25 = *(ulong *)(*pauVar24 + uVar25) & 0x8080808080808080;
          if (uVar25 != 0x8080808080808080) {
            uVar25 = uVar25 ^ 0x8080808080808080;
            pDVar1 = *key;
            do {
              lVar6 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              pDVar2 = *(Descriptor **)((long)ppDVar21 + ((ulong)((uint)lVar6 & 0xfffffff8) - 8));
              if ((pDVar2 == pDVar1) &&
                 (auVar9._8_8_ = 0,
                 auVar9._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar2,
                 auVar10._8_8_ = 0,
                 auVar10._0_8_ =
                      &pDVar2->super_SymbolBase +
                      (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
                      SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)),
                 uVar23 != (SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
                           SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0)))) {
                auVar18._8_8_ = 0;
                auVar18._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar1;
                pSVar22 = &pDVar1->super_SymbolBase +
                          (SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),0) ^
                          SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),8));
                goto LAB_0021ba75;
              }
              uVar25 = uVar25 & uVar25 - 1;
            } while (uVar25 != 0);
          }
        }
        else if (1 < *(ulong *)(this + 8)) {
          uVar25 = *(ulong *)(this + 8) >> 1;
          pDVar3 = *key;
          while( true ) {
            auVar7 = *pauVar24;
            uVar26 = (uint)(ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar7[0xf] >> 7) << 0xf);
            if (uVar26 != 0xffff) {
              uVar26 = ~uVar26;
              do {
                uVar5 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                  }
                }
                if ((char)(*pauVar24)[uVar5] < '\0') {
                  __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x764,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                               );
                }
                pDVar4 = ppDVar21[uVar5];
                if ((pDVar4 == pDVar3) &&
                   (auVar14._8_8_ = 0,
                   auVar14._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar4,
                   auVar15._8_8_ = 0,
                   auVar15._0_8_ =
                        &pDVar4->super_SymbolBase +
                        (SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),0) ^
                        SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),8)),
                   uVar23 != (SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),8) ^
                             SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),0)))) {
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar3;
                  pSVar22 = &pDVar3->super_SymbolBase +
                            (SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),0) ^
                            SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),8));
                  goto LAB_0021ba75;
                }
                uVar25 = uVar25 - 1;
                uVar20 = (ushort)(uVar26 - 1) & (ushort)uVar26;
                uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar20);
              } while (uVar20 != 0);
            }
            if (uVar25 == 0) break;
            ppDVar21 = ppDVar21 + 0x10;
            puVar19 = *pauVar24;
            pauVar24 = pauVar24 + 1;
            if (puVar19[0xf] == -1) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

size_t capacity() const {
    const size_t cap = common().capacity();
    // Compiler complains when using functions in assume so use local variables.
    ABSL_ATTRIBUTE_UNUSED static constexpr bool kEnabled = SooEnabled();
    ABSL_ATTRIBUTE_UNUSED static constexpr size_t kCapacity = SooCapacity();
    ABSL_ASSUME(!kEnabled || cap >= kCapacity);
    return cap;
  }